

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.h
# Opt level: O0

void __thiscall Group::print(Group *this,int day_id)

{
  bool bVar1;
  ostream *poVar2;
  reference pLVar3;
  undefined1 local_d8 [8];
  Lesson lesson;
  iterator __end2;
  iterator __begin2;
  vector<Lesson,_std::allocator<Lesson>_> *__range2;
  int i;
  int day_id_local;
  Group *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"group_id:");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  for (__range2._0_4_ = 0; (int)__range2 < 0x2a; __range2._0_4_ = (int)__range2 + 1) {
    if ((int)__range2 % 7 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Day: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)__range2 / 7);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    __end2 = std::vector<Lesson,_std::allocator<Lesson>_>::begin(&this->lesson_map);
    lesson._160_8_ = std::vector<Lesson,_std::allocator<Lesson>_>::end(&this->lesson_map);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end2,(__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>
                                  *)&lesson.field_0xa0);
      if (!bVar1) break;
      pLVar3 = __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>
               ::operator*(&__end2);
      Lesson::Lesson((Lesson *)local_d8,pLVar3);
      if (local_d8 == (undefined1  [8])(long)(int)__range2) {
        Lesson::print((Lesson *)local_d8);
      }
      Lesson::~Lesson((Lesson *)local_d8);
      __gnu_cxx::__normal_iterator<Lesson_*,_std::vector<Lesson,_std::allocator<Lesson>_>_>::
      operator++(&__end2);
    }
  }
  return;
}

Assistant:

void Group::print(int day_id) {

    std::cout << "group_id:" << groupNumber << std::endl;

    for (int i = 0; i < 42; i++) {
        if(i % 7 == 0)
            std::cout << "Day: " << i / 7 << std::endl
                         ;
        for (auto lesson: lesson_map) {
            if(lesson.lesson_id == i) {
                lesson.print();
            }

        }
    }

}